

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,google::protobuf::json_internal::ResolverPool::Field_const*>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::json_internal::ResolverPool::Field_const*>>>
::try_emplace_impl<int,google::protobuf::json_internal::ResolverPool::Field_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *k,Field **args)

{
  tuple<const_google::protobuf::json_internal::ResolverPool::Field_*&&> local_30;
  tuple<int_&&> local_28;
  
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
  ::find_or_prepare_insert<int>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
              *)this,k);
  if (__return_storage_ptr__->second == true) {
    local_30.super__Tuple_impl<0UL,_const_google::protobuf::json_internal::ResolverPool::Field_*&&>.
    super__Head_base<0UL,_const_google::protobuf::json_internal::ResolverPool::Field_*&&,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_const_google::protobuf::json_internal::ResolverPool::Field_*&&>
                   )(_Tuple_impl<0UL,_const_google::protobuf::json_internal::ResolverPool::Field_*&&>
                     )args;
    local_28.super__Tuple_impl<0UL,_int_&&>.super__Head_base<0UL,_int_&&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_int_&&>)(_Tuple_impl<0UL,_int_&&>)k;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,google::protobuf::json_internal::ResolverPool::Field_const*>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::json_internal::ResolverPool::Field_const*>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<google::protobuf::json_internal::ResolverPool::Field_const*&&>>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,google::protobuf::json_internal::ResolverPool::Field_const*>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::json_internal::ResolverPool::Field_const*>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_28,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }